

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

bool __thiscall
spvc_resources_s::copy_resources
          (spvc_resources_s *this,SmallVector<spvc_reflected_resource,_8UL> *outputs,
          SmallVector<spirv_cross::Resource,_8UL> *inputs)

{
  Resource *pRVar1;
  undefined1 local_60 [8];
  spvc_reflected_resource r;
  Resource *i;
  Resource *__end1;
  Resource *__begin1;
  SmallVector<spirv_cross::Resource,_8UL> *__range1;
  SmallVector<spirv_cross::Resource,_8UL> *inputs_local;
  SmallVector<spvc_reflected_resource,_8UL> *outputs_local;
  spvc_resources_s *this_local;
  
  __end1 = spirv_cross::VectorView<spirv_cross::Resource>::begin
                     (&inputs->super_VectorView<spirv_cross::Resource>);
  pRVar1 = spirv_cross::VectorView<spirv_cross::Resource>::end
                     (&inputs->super_VectorView<spirv_cross::Resource>);
  while( true ) {
    if (__end1 == pRVar1) {
      return true;
    }
    r.name = (char *)__end1;
    local_60._4_4_ =
         spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->base_type_id);
    r.id = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)(r.name + 4));
    local_60._0_4_ = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)r.name);
    r._8_8_ = spvc_context_s::allocate_name(this->context,(string *)(r.name + 0x10));
    if ((char *)r._8_8_ == (char *)0x0) break;
    spirv_cross::SmallVector<spvc_reflected_resource,_8UL>::push_back
              (outputs,(spvc_reflected_resource *)local_60);
    __end1 = __end1 + 1;
  }
  return false;
}

Assistant:

bool spvc_resources_s::copy_resources(SmallVector<spvc_reflected_resource> &outputs,
                                      const SmallVector<Resource> &inputs)
{
	for (auto &i : inputs)
	{
		spvc_reflected_resource r;
		r.base_type_id = i.base_type_id;
		r.type_id = i.type_id;
		r.id = i.id;
		r.name = context->allocate_name(i.name);
		if (!r.name)
			return false;

		outputs.push_back(r);
	}

	return true;
}